

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2-client.c
# Opt level: O1

_Bool ssh2channel_send_serial_break(SshChannel *sc,_Bool want_reply,int length)

{
  SshChannelVtable *pSVar1;
  PktOut *pPVar2;
  cr_handler_fn_t handler;
  undefined7 in_register_00000031;
  
  pSVar1 = sc[-0xb].vt;
  handler = ssh2_channel_response;
  if ((int)CONCAT71(in_register_00000031,want_reply) == 0) {
    handler = (cr_handler_fn_t)0x0;
  }
  pPVar2 = ssh2_chanreq_init((ssh2_channel *)(sc + -0xb),"break",handler,(void *)0x0);
  BinarySink_put_uint32(pPVar2->binarysink_,(long)length);
  pq_base_push((PacketQueueBase *)pSVar1[1].request_agent_forwarding,&pPVar2->qnode);
  return true;
}

Assistant:

bool ssh2channel_send_serial_break(SshChannel *sc, bool want_reply, int length)
{
    struct ssh2_channel *c = container_of(sc, struct ssh2_channel, sc);
    struct ssh2_connection_state *s = c->connlayer;

    PktOut *pktout = ssh2_chanreq_init(
        c, "break", want_reply ? ssh2_channel_response : NULL, NULL);
    put_uint32(pktout, length);
    pq_push(s->ppl.out_pq, pktout);

    return true;
}